

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.c
# Opt level: O0

DH * ossl_d2i_DHx_PUBKEY(DH **a,uchar **pp,long length)

{
  undefined8 uVar1;
  int iVar2;
  EVP_PKEY *pkey_00;
  EVP_PKEY **in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  uchar *q;
  DH *key;
  EVP_PKEY *pkey;
  uchar **in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  local_8 = (DH *)0x0;
  uVar1 = *in_RSI;
  pkey_00 = ossl_d2i_PUBKEY_legacy(in_RDX,in_stack_ffffffffffffffd8,0);
  if (pkey_00 == (EVP_PKEY *)0x0) {
    local_8 = (DH *)0x0;
  }
  else {
    iVar2 = EVP_PKEY_get_id(pkey_00);
    if (iVar2 == 0x398) {
      local_8 = (DH *)EVP_PKEY_get1_DH((EVP_PKEY *)pkey_00);
    }
    EVP_PKEY_free((EVP_PKEY *)pkey_00);
    if (local_8 == (DH *)0x0) {
      local_8 = (DH *)0x0;
    }
    else {
      *in_RSI = uVar1;
      if (in_RDI != (undefined8 *)0x0) {
        DH_free((DH *)*in_RDI);
        *in_RDI = local_8;
      }
    }
  }
  return local_8;
}

Assistant:

DH *ossl_d2i_DHx_PUBKEY(DH **a, const unsigned char **pp, long length)
{
    EVP_PKEY *pkey;
    DH *key = NULL;
    const unsigned char *q;

    q = *pp;
    pkey = ossl_d2i_PUBKEY_legacy(NULL, &q, length);
    if (pkey == NULL)
        return NULL;
    if (EVP_PKEY_get_id(pkey) == EVP_PKEY_DHX)
        key = EVP_PKEY_get1_DH(pkey);
    EVP_PKEY_free(pkey);
    if (key == NULL)
        return NULL;
    *pp = q;
    if (a != NULL) {
        DH_free(*a);
        *a = key;
    }
    return key;
}